

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.h
# Opt level: O2

shared_ptr<vmips::CFGNode> __thiscall
vmips::Function::branch_existing<vmips::j>(Function *this,shared_ptr<vmips::CFGNode> *node)

{
  __shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<vmips::CFGNode> sVar1;
  
  CFGNode::branch_existing<vmips::j>
            ((CFGNode *)
             node[0x14].super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi,(shared_ptr<vmips::CFGNode> *)in_RDX);
  vmips::Function::switch_to((shared_ptr *)node);
  std::__shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2> *)this,in_RDX);
  sVar1.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<vmips::CFGNode>)
         sVar1.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<CFGNode> branch_existing(const std::shared_ptr<CFGNode> &node, Args &&...args) {
            cursor->branch_existing<Instr>(node, std::forward<Args>(args)...);
            switch_to(node);
            return node;
        }